

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GLMClassifier::InternalSwap(GLMClassifier *this,GLMClassifier *other)

{
  GLMClassifier *other_local;
  GLMClassifier *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::InternalSwap
            (&this->weights_,&other->weights_);
  google::protobuf::RepeatedField<double>::InternalSwap(&this->offset_,&other->offset_);
  google::protobuf::internal::memswap<8>
            ((char *)&this->postevaluationtransform_,(char *)&other->postevaluationtransform_);
  std::swap<CoreML::Specification::GLMClassifier::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  return;
}

Assistant:

void GLMClassifier::InternalSwap(GLMClassifier* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  weights_.InternalSwap(&other->weights_);
  offset_.InternalSwap(&other->offset_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(GLMClassifier, classencoding_)
      + sizeof(GLMClassifier::classencoding_)
      - PROTOBUF_FIELD_OFFSET(GLMClassifier, postevaluationtransform_)>(
          reinterpret_cast<char*>(&postevaluationtransform_),
          reinterpret_cast<char*>(&other->postevaluationtransform_));
  swap(ClassLabels_, other->ClassLabels_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}